

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_12.cpp
# Opt level: O1

void reverse_chars(string *from,string *to)

{
  uint *puVar1;
  uint uVar2;
  long lVar3;
  long *plVar4;
  size_type *psVar5;
  iterator iVar6;
  char ch;
  ofstream out_file;
  ifstream in_file;
  string local_488;
  char *local_468;
  iterator iStack_460;
  char *local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  long local_430;
  filebuf local_428 [20];
  uint uStack_414;
  byte abStack_410 [216];
  ios_base local_338 [264];
  long local_230 [3];
  uint uStack_214;
  uint auStack_210 [122];
  
  std::ifstream::ifstream(local_230,(string *)from,_S_in);
  if ((*(byte *)((long)auStack_210 + *(long *)(local_230[0] + -0x18)) & 5) != 0) {
    file_open_err(from,in);
  }
  std::ofstream::ofstream(&local_430,(string *)to,_S_out);
  if ((abStack_410[*(long *)(local_430 + -0x18)] & 5) != 0) {
    file_open_err(to,out);
  }
  lVar3 = *(long *)(local_230[0] + -0x18);
  puVar1 = (uint *)((long)&uStack_214 + lVar3);
  *puVar1 = *puVar1 | 1;
  std::ios::clear((int)&local_488 + (int)lVar3 + 600);
  lVar3 = *(long *)(local_430 + -0x18);
  puVar1 = (uint *)((long)&uStack_414 + lVar3);
  *puVar1 = *puVar1 | 1;
  std::ios::clear((int)&local_488 + (int)lVar3 + 0x58);
  local_468 = (char *)0x0;
  iStack_460._M_current = (char *)0x0;
  local_458 = (char *)0x0;
  local_488._M_dataplus._M_p = local_488._M_dataplus._M_p & 0xffffffffffffff00;
  while( true ) {
    plVar4 = (long *)std::istream::get((char *)local_230);
    if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) break;
    if (iStack_460._M_current == local_458) {
      std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                ((vector<char,std::allocator<char>> *)&local_468,iStack_460,(char *)&local_488);
    }
    else {
      *iStack_460._M_current = (char)local_488._M_dataplus._M_p;
      iStack_460._M_current = iStack_460._M_current + 1;
    }
  }
  uVar2 = *(uint *)((long)auStack_210 + *(long *)(local_230[0] + -0x18));
  if ((char)((uVar2 & 2) >> 1) == '\0' && (uVar2 & 5) != 0) {
    std::operator+(&local_450,"An error occurred while reading data from file \'",from);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_450);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_488.field_2._M_allocated_capacity = *psVar5;
      local_488.field_2._8_8_ = plVar4[3];
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
    }
    else {
      local_488.field_2._M_allocated_capacity = *psVar5;
      local_488._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_488._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    error(&local_488);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
  }
  if (iStack_460._M_current != local_468) {
    iVar6._M_current = iStack_460._M_current;
    do {
      local_488._M_dataplus._M_p._0_1_ = iVar6._M_current[-1];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_430,(char *)&local_488,1)
      ;
      iVar6._M_current = iVar6._M_current + -1;
    } while (iVar6._M_current != local_468);
  }
  if ((abStack_410[*(long *)(local_430 + -0x18)] & 5) != 0) {
    std::operator+(&local_450,"An error occurred while writing data to file \'",to);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_450);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_488.field_2._M_allocated_capacity = *psVar5;
      local_488.field_2._8_8_ = plVar4[3];
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
    }
    else {
      local_488.field_2._M_allocated_capacity = *psVar5;
      local_488._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_488._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    error(&local_488);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_468 != (char *)0x0) {
    operator_delete(local_468,(long)local_458 - (long)local_468);
  }
  local_430 = _VTT;
  *(undefined8 *)(local_428 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_428);
  std::ios_base::~ios_base(local_338);
  std::ifstream::~ifstream(local_230);
  return;
}

Assistant:

void reverse_chars(const std::string& from, const std::string& to)
{
	std::ifstream in_file{ from };
	if (!in_file)
	{
		file_open_err(from, FileType::in);
	}
	std::ofstream out_file{ to };
	if (!out_file)
	{
		file_open_err(to, FileType::out);
	}
	in_file.exceptions(in_file.exceptions() | std::ios::badbit);
	out_file.exceptions(out_file.exceptions() | std::ios::badbit);
	auto chars = std::vector<char>();
	for (auto ch = char(); in_file.get(ch);)
	{
		chars.push_back(ch);
	}
	if (in_file.fail() && !in_file.eof())
	{
		error("An error occurred while reading data from file '" + from + "'.");
	}

	for (auto rit = chars.rbegin(); rit != chars.rend(); ++rit)
	{
		out_file << *rit;
	}
	if (out_file.fail())
	{
		error("An error occurred while writing data to file '" + to + "'.");
	}
}